

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

Result * __thiscall
CoreML::
validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,string *name,
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          *allowedFeatureTypes)

{
  int iVar1;
  Type *featureDesc;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Result result;
  
  Result::Result(&result);
  index = 0;
  do {
    if (*(int *)(this + 8) <= index) {
      std::operator+(&local_90,"Expected feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)features);
      std::operator+(&local_70,&local_90,"\' to the model is not present in the model description.")
      ;
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
LAB_0026cb63:
      std::__cxx11::string::~string((string *)&result.m_message);
      return __return_storage_ptr__;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              ((RepeatedPtrFieldBase *)this,index);
    iVar1 = std::__cxx11::string::compare((string *)features);
    if (iVar1 == 0) {
      featureDesc = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              ((RepeatedPtrFieldBase *)this,index);
      validateSchemaTypes(__return_storage_ptr__,
                          (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           *)name,featureDesc);
      goto LAB_0026cb63;
    }
    index = index + 1;
  } while( true );
}

Assistant:

inline Result validateDescriptionsContainFeatureWithNameAndType(const Descriptions &features,
                                                                    const std::string &name,
                                                                    const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes) {
        Result result;
        for (int i = 0; i < features.size(); i++) {
            if (name.compare(features[i].name()) != 0) {
                continue;
            }
            return validateSchemaTypes(allowedFeatureTypes, features[i]);
        }

        return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH, "Expected feature '" + name + "' to the model is not present in the model description.");
    }